

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

double anon_unknown.dwarf_1e45e::sampleY<float>
                 (TypedImageChannel<float> *channel,int h,int x,double y,Extrapolation ext)

{
  uint x_00;
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  float *pfVar7;
  uint x_01;
  double dVar8;
  double dVar9;
  
  if (0.0 <= y) {
    x_01 = (uint)y;
  }
  else {
    dVar8 = -y;
    x_01 = -((uint)((double)(int)dVar8 < dVar8) + (int)dVar8);
  }
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar9 = 0.0;
    dVar8 = 0.0;
    if ((int)x_01 < h && -1 < (int)x_01) {
      dVar8 = (double)(channel->_pixels)._data[(ulong)x_01 * (channel->_pixels)._sizeY + (long)x];
    }
    if (h <= (int)x_00 || (int)x_01 < -1) goto LAB_00109eaa;
    pfVar7 = (channel->_pixels)._data + (long)(int)x_00 * (channel->_pixels)._sizeY + (long)x;
    break;
  case CLAMP:
    uVar5 = h - 1;
    uVar2 = uVar5;
    if ((int)x_01 < (int)uVar5) {
      uVar2 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar2 = 0;
    }
    if ((int)x_00 < (int)uVar5) {
      uVar5 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar5 = 0;
    }
    lVar6 = (channel->_pixels)._sizeY;
    pfVar7 = (channel->_pixels)._data;
    dVar8 = (double)pfVar7[(int)uVar2 * lVar6 + (long)x];
    pfVar7 = pfVar7 + (int)uVar5 * lVar6 + (long)x;
    break;
  case PERIODIC:
    if ((int)x_01 < 0) {
      if (-1 < h) {
        uVar2 = (~x_01 + h) / (uint)h;
        goto LAB_00109e0c;
      }
      uVar2 = (~h - x_01) / (uint)-h;
    }
    else if (h < 0) {
      uVar2 = x_01 / (uint)-h;
LAB_00109e0c:
      uVar2 = -uVar2;
    }
    else {
      uVar2 = x_01 / (uint)h;
    }
    if ((int)x_01 < -1) {
      if (-1 < h) {
        uVar5 = ((h - x_01) - 2) / (uint)h;
        goto LAB_00109e5a;
      }
      uVar5 = (~h - x_00) / (uint)-h;
    }
    else if (h < 0) {
      uVar5 = x_00 / (uint)-h;
LAB_00109e5a:
      uVar5 = -uVar5;
    }
    else {
      uVar5 = x_00 / (uint)h;
    }
    lVar6 = (channel->_pixels)._sizeY;
    pfVar7 = (channel->_pixels)._data;
    fVar1 = pfVar7[(int)(x_01 - uVar2 * h) * lVar6 + (long)x];
    lVar6 = (int)(x_00 - uVar5 * h) * lVar6;
    goto LAB_00109e9b;
  case MIRROR:
    iVar3 = mirror(x_01,h);
    iVar4 = mirror(x_00,h);
    lVar6 = (channel->_pixels)._sizeY;
    pfVar7 = (channel->_pixels)._data;
    fVar1 = pfVar7[iVar3 * lVar6 + (long)x];
    lVar6 = iVar4 * lVar6;
LAB_00109e9b:
    dVar8 = (double)fVar1;
    pfVar7 = pfVar7 + lVar6 + x;
    break;
  default:
    dVar8 = 0.0;
    dVar9 = 0.0;
    goto LAB_00109eaa;
  }
  dVar9 = (double)*pfVar7;
LAB_00109eaa:
  return ((double)(int)x_00 - y) * dVar8 + (1.0 - ((double)(int)x_00 - y)) * dVar9;
}

Assistant:

double
sampleY (
    const TypedImageChannel<T>& channel,
    int                         h,
    int                         x,
    double                      y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is an integer, and y is a floating point number.
    //

    int    ys = IMATH_NAMESPACE::floor (y);
    int    yt = ys + 1;
    double s  = yt - y;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (ys >= 0 && ys < h) ? double (channel (x, ys)) : 0.0;
            vt = (yt >= 0 && yt < h) ? double (channel (x, yt)) : 0.0;
            break;

        case CLAMP:

            ys = IMATH_NAMESPACE::clamp (ys, 0, h - 1);
            yt = IMATH_NAMESPACE::clamp (yt, 0, h - 1);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case PERIODIC:

            ys = modp (ys, h);
            yt = modp (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;

        case MIRROR:

            ys = mirror (ys, h);
            yt = mirror (yt, h);
            vs = channel (x, ys);
            vt = channel (x, yt);
            break;
    }

    return s * vs + t * vt;
}